

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void gl4cts::GLSL420Pack::Utils::program::printShaderSource
               (shaderSource *source,MessageBuilder *log)

{
  ulong uVar1;
  size_type sVar2;
  MessageBuilder *pMVar3;
  const_reference pvVar4;
  _Setw local_70 [4];
  char *local_60;
  GLchar *next_line;
  string line;
  GLchar *part;
  uint local_24;
  uint local_20;
  uint local_1c;
  GLuint i;
  GLuint line_number;
  MessageBuilder *log_local;
  shaderSource *source_local;
  
  local_1c = 0;
  _i = log;
  log_local = (MessageBuilder *)source;
  tcu::MessageBuilder::operator<<(log,(char (*) [15])"Shader source.");
  local_20 = 0;
  while( true ) {
    uVar1 = (ulong)local_20;
    sVar2 = std::
            vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
            ::size((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                    *)log_local);
    if (sVar2 <= uVar1) break;
    pMVar3 = tcu::MessageBuilder::operator<<(_i,(char (*) [14])"\nLine||Part: ");
    local_24 = local_20 + 1;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_24);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2bb3658);
    part = (GLchar *)
           std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::size((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                   *)log_local);
    tcu::MessageBuilder::operator<<(pMVar3,(unsigned_long *)&part);
    if (((log_local->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10 & 1) == 1)
    {
      pMVar3 = tcu::MessageBuilder::operator<<(_i,(char (*) [10])" Length: ");
      pvVar4 = std::
               vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                             *)log_local,(ulong)local_20);
      tcu::MessageBuilder::operator<<(pMVar3,&pvVar4->m_length);
    }
    tcu::MessageBuilder::operator<<(_i,(char (*) [2])0x2b9e07b);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                  *)log_local,(ulong)local_20);
    line.field_2._8_8_ = std::__cxx11::string::c_str();
    while (line.field_2._8_8_ != 0) {
      std::__cxx11::string::string((string *)&next_line);
      local_60 = strchr((char *)line.field_2._8_8_,10);
      if (local_60 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&next_line,(char *)line.field_2._8_8_);
      }
      else {
        local_60 = local_60 + 1;
        std::__cxx11::string::assign((char *)&next_line,line.field_2._8_8_);
      }
      pMVar3 = _i;
      if (*(char *)line.field_2._8_8_ != '\0') {
        local_70[0] = std::setw(4);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_70);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])"||");
        tcu::MessageBuilder::operator<<
                  (pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &next_line);
      }
      line.field_2._8_8_ = local_60;
      local_1c = local_1c + 1;
      std::__cxx11::string::~string((string *)&next_line);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Utils::program::printShaderSource(const shaderSource& source, tcu::MessageBuilder& log)
{
	GLuint line_number = 0;

	log << "Shader source.";

	for (GLuint i = 0; i < source.m_parts.size(); ++i)
	{
		log << "\nLine||Part: " << (i + 1) << "/" << source.m_parts.size();

		if (true == source.m_use_lengths)
		{
			log << " Length: " << source.m_parts[i].m_length;
		}

		log << "\n";

		const GLchar* part = source.m_parts[i].m_code.c_str();

		while (0 != part)
		{
			std::string   line;
			const GLchar* next_line = strchr(part, '\n');

			if (0 != next_line)
			{
				next_line += 1;
				line.assign(part, next_line - part);
			}
			else
			{
				line = part;
			}

			if (0 != *part)
			{
				log << std::setw(4) << line_number << "||" << line;
			}

			part = next_line;
			line_number += 1;
		}
	}
}